

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringAtoRealMethod::~StringAtoRealMethod(StringAtoRealMethod *this)

{
  StringAtoRealMethod *this_local;
  
  ~StringAtoRealMethod(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringAtoRealMethod(Compilation& comp) :
        SimpleSystemSubroutine("atoreal", SubroutineKind::Function, 0, {}, comp.getRealType(),
                               true) {}